

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditIconButton::updateCursor(QLineEditIconButton *this)

{
  bool bVar1;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  double unaff_retaddr;
  double in_stack_00000008;
  QCursor in_stack_fffffffffffffff0;
  QWidget *this_00;
  
  this_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    pQVar2 = QWidget::parentWidget((QWidget *)0x5d37e5);
    if (pQVar2 != (QWidget *)0x0) {
      QWidget::parentWidget((QWidget *)0x5d3803);
      QWidget::cursor(this_00);
      goto LAB_005d3810;
    }
  }
  QCursor::QCursor((QCursor *)&stack0xfffffffffffffff0,ArrowCursor);
LAB_005d3810:
  QWidget::setCursor(this_00,(QCursor *)in_stack_fffffffffffffff0.d);
  QCursor::~QCursor((QCursor *)&stack0xfffffffffffffff0);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::updateCursor()
{
#ifndef QT_NO_CURSOR
    setCursor(qFuzzyCompare(m_opacity, qreal(1.0)) || !parentWidget() ? QCursor(Qt::ArrowCursor) : parentWidget()->cursor());
#endif
}